

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<long_double> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  context *this_00;
  context *ctx_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  quadratic_cost_type<long_double> *pqVar6;
  int iVar7;
  long loop;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble theta;
  longdouble delta;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar12;
  quadratic_cost_type<long_double> norm_costs;
  bit_array x;
  compute_order compute;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  slv;
  quadratic_cost_type<long_double> local_170;
  long local_150;
  double local_148;
  double local_140;
  bit_array_impl local_138;
  compute_order local_128;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  local_c8;
  
  pqVar6 = original_costs;
  bit_array_impl::bit_array_impl(&local_138,variables);
  this_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
            (&local_170,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<long_double> *)ctx,(random_engine *)(ulong)(uint)variables,
             (int)pqVar6);
  lVar8 = (longdouble)(this_00->parameters).kappa_step;
  lVar9 = (longdouble)(this_00->parameters).kappa_max;
  theta = (longdouble)(this_00->parameters).theta;
  dVar12 = (this_00->parameters).delta;
  if (0.0 <= dVar12) {
    delta = (longdouble)dVar12;
    local_140 = dVar12;
  }
  else {
    ctx_00 = this->m_ctx;
    lVar10 = in_ST5;
    local_c8._0_10_ = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    quadratic_cost_type<long_double>::min(&local_170,variables);
    local_d8 = in_ST0 - (longdouble)local_c8._0_10_ * in_ST0;
    local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = in_ST0;
    info<long_double,long_double,long_double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_d8,
               (longdouble *)&local_128,(longdouble *)&local_c8);
    delta = local_d8;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar10;
  }
  local_e4 = (longdouble)(this_00->parameters).pushing_k_factor;
  local_f0 = (longdouble)(this_00->parameters).pushing_objective_amplifier;
  local_150 = (long)(this_00->parameters).w;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  ::solver_inequalities_101coeff
            (&local_c8,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_170,constraints);
  compute_order::compute_order(&local_128,(this_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    bVar5 = false;
    do {
      this->m_call_number = this->m_call_number + 1;
      local_148 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::reinit(best_recorder,ctx,bVar5,(this_00->parameters).kappa_min,
                           (this_00->parameters).kappa_max,(bit_array *)&local_138);
      lVar10 = (longdouble)local_148;
      compute_order::
      init<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                (&local_128,&local_c8,(bit_array *)&local_138);
      iVar4 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        loop = 0;
        bVar5 = false;
        lVar11 = lVar10;
        while (loop != (this_00->parameters).limit) {
          iVar7 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                            (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,lVar11,delta,
                             theta);
          if (iVar7 == 0) {
            dVar12 = quadratic_cost_type<long_double>::results
                               (original_costs,(bit_array *)&local_138,cost_constant);
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar12,loop);
            bVar5 = true;
            iVar4 = 0;
            bVar1 = false;
          }
          else {
            if (iVar7 <= iVar4) {
              iVar4 = iVar7;
            }
            if (local_150 < loop) {
              powl();
              lVar11 = lVar11 + lVar8 * in_ST0;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
            }
            bVar1 = lVar11 <= lVar9;
            in_ST5 = in_ST4;
          }
          if ((!bVar1) || (loop = loop + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
        }
      }
      else {
        bVar5 = false;
      }
      if (iVar4 < 1) {
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar4 = 0;
          iVar7 = 0;
          do {
            if ((this_00->parameters).pushes_limit <= iVar7) break;
            iVar2 = compute_order::
                    push_and_run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                              (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,local_e4,delta
                               ,theta,local_f0);
            if (iVar2 == 0) {
              dVar12 = quadratic_cost_type<long_double>::results
                                 (original_costs,(bit_array *)&local_138,cost_constant);
              best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar12,
                           (long)~((this_00->parameters).pushing_iteration_limit * iVar7));
              bVar5 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              iVar2 = 1;
              lVar11 = lVar10;
              while (iVar2 + -1 < (this_00->parameters).pushing_iteration_limit) {
                iVar3 = compute_order::
                        run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                                  (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,lVar11,
                                   delta,theta);
                if (iVar3 == 0) {
                  dVar12 = quadratic_cost_type<long_double>::results
                                     (original_costs,(bit_array *)&local_138,cost_constant);
                  best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar12,
                               (long)((this_00->parameters).pushing_iteration_limit * iVar4 - iVar2)
                              );
                  bVar5 = true;
                  break;
                }
                if ((this_00->parameters).w < (double)(iVar2 + -1)) {
                  powl();
                  lVar11 = lVar11 + lVar8 * in_ST0;
                  in_ST0 = in_ST1;
                  in_ST1 = in_ST2;
                  in_ST2 = in_ST3;
                  in_ST3 = in_ST4;
                  in_ST4 = in_ST5;
                }
                in_ST5 = in_ST4;
                if ((lVar9 < lVar11) || (iVar2 = iVar2 + 1, ((stop_task->_M_base)._M_i & 1U) != 0))
                break;
              }
            }
            iVar7 = iVar7 + 1;
            iVar4 = iVar4 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_138,iVar4,(this_00->parameters).limit);
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_128.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  ::~solver_inequalities_101coeff(&local_c8);
  if ((_Head_base<0UL,_int_*,_false>)
      local_170.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_170.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_170.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if (local_170.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
       )0x0) {
    operator_delete__((void *)local_170.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_170.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
  _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>,_true,_true>
                  )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                    )0x0;
  if (local_170.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>)0x0) {
    operator_delete__((void *)local_170.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_138.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_138.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }